

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D.c
# Opt level: O1

int Jac(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *user_data,N_Vector tmp)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  double dVar7;
  
  lVar3 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar2 = *(double *)((long)user_data + 8);
  lVar4 = N_VGetArrayPointer();
  if (lVar4 == 0) {
    Jac_cold_2();
  }
  else {
    puVar5 = (undefined8 *)N_VGetArrayPointer(Jv);
    if (puVar5 != (undefined8 *)0x0) {
      N_VConst(0,Jv);
      *puVar5 = 0;
      if (2 < lVar3) {
        dVar7 = (dVar1 / dVar2) / dVar2;
        lVar6 = 0;
        do {
          puVar5[lVar6 + 1] =
               *(double *)(lVar4 + 0x10 + lVar6 * 8) * dVar7 +
               *(double *)(lVar4 + lVar6 * 8) * dVar7 +
               *(double *)(lVar4 + 8 + lVar6 * 8) * (((dVar1 * -2.0) / dVar2) / dVar2);
          lVar6 = lVar6 + 1;
        } while (lVar3 + -2 != lVar6);
      }
      puVar5[lVar3 + -1] = 0;
      return 0;
    }
    Jac_cold_1();
  }
  return 1;
}

Assistant:

static int Jac(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y, N_Vector fy,
               void* user_data, N_Vector tmp)
{
  UserData udata = (UserData)user_data; /* variable shortcuts */
  sunindextype N = udata->N;
  sunrealtype k  = udata->k;
  sunrealtype dx = udata->dx;
  sunrealtype *V = NULL, *JV = NULL;
  sunrealtype c1, c2;
  sunindextype i;

  V = N_VGetArrayPointer(v); /* access data arrays */
  if (check_flag((void*)V, "N_VGetArrayPointer", 0)) { return 1; }
  JV = N_VGetArrayPointer(Jv);
  if (check_flag((void*)JV, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, Jv); /* initialize Jv product to zero */

  /* iterate over domain, computing all Jacobian-vector products */
  c1    = k / dx / dx;
  c2    = -SUN_RCONST(2.0) * k / dx / dx;
  JV[0] = 0.0;
  for (i = 1; i < N - 1; i++)
  {
    JV[i] = c1 * V[i - 1] + c2 * V[i] + c1 * V[i + 1];
  }
  JV[N - 1] = 0.0;

  return 0; /* Return with success */
}